

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_dr_wav_s32_to_s16(ma_int16 *pOut,ma_int32 *pIn,size_t sampleCount)

{
  size_t i;
  
  for (i = 0; sampleCount != i; i = i + 1) {
    pOut[i] = *(ma_int16 *)((long)pIn + i * 4 + 2);
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_s32_to_s16(ma_int16* pOut, const ma_int32* pIn, size_t sampleCount)
{
    int r;
    size_t i;
    for (i = 0; i < sampleCount; ++i) {
        int x = pIn[i];
        r = x >> 16;
        pOut[i] = (short)r;
    }
}